

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedjson.cpp
# Opt level: O3

bool __thiscall ParsedJson::printjson(ParsedJson *this,ostream *os)

{
  ulong uVar1;
  byte bVar2;
  ostream *poVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  char local_56 [6];
  ostream *local_50;
  ParsedJson *local_48;
  void *local_40;
  ulong local_38;
  
  if (this->isvalid == true) {
    local_50 = os;
    if ((char)(*this->tape >> 0x38) == 'r') {
      uVar8 = *this->tape & 0xffffffffffffff;
      if (uVar8 <= this->tapecapacity) {
        uVar10 = this->depthcapacity;
        pvVar4 = operator_new__(uVar10);
        pvVar5 = operator_new__(-(ulong)(uVar10 >> 0x3d != 0) | uVar10 << 3);
        *(undefined8 *)((long)pvVar5 + 8) = 0;
        *(undefined1 *)((long)pvVar4 + 1) = 0;
        local_40 = pvVar4;
        if (1 < uVar8) {
          local_38 = 1;
          uVar10 = 1;
          local_48 = this;
          do {
            uVar1 = this->tape[uVar10];
            lVar9 = (long)(int)local_38;
            uVar6 = *(ulong *)((long)pvVar5 + lVar9 * 8);
            bVar2 = (byte)(uVar1 >> 0x38);
            if (*(char *)((long)local_40 + lVar9) == '\0') {
              if ((uVar6 != 0) && (pcVar7 = ",", bVar2 != 0x5d)) {
LAB_00107914:
                std::__ostream_insert<char,std::char_traits<char>>(local_50,pcVar7,1);
                uVar6 = *(ulong *)((long)pvVar5 + lVar9 * 8);
              }
            }
            else if (uVar6 == 0) {
              uVar6 = 0;
            }
            else {
              if (((uVar6 & 1) == 0) && (bVar2 != 0x7d)) {
                std::__ostream_insert<char,std::char_traits<char>>(local_50,",",1);
                uVar6 = *(ulong *)((long)pvVar5 + lVar9 * 8);
              }
              pcVar7 = ":";
              if ((uVar6 & 1) != 0) goto LAB_00107914;
            }
            this = local_48;
            poVar3 = local_50;
            *(ulong *)((long)pvVar5 + lVar9 * 8) = uVar6 + 1;
            if (bVar2 < 0x6c) {
              if (bVar2 < 0x5d) {
                if (bVar2 != 0x22) {
                  if (bVar2 != 0x5b) goto switchD_00107950_caseD_6d;
                  local_56[4] = 0x5b;
                  std::__ostream_insert<char,std::char_traits<char>>(local_50,local_56 + 4,1);
                  *(undefined1 *)((long)local_40 + lVar9 + 1) = 0;
                  goto LAB_00107b41;
                }
                local_56[0] = '\"';
                std::__ostream_insert<char,std::char_traits<char>>(local_50,local_56,1);
                this = local_48;
                print_with_escapes(local_48->string_buf + (uVar1 & 0xffffffffffffff));
                local_56[1] = 0x22;
                std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_56 + 1,1);
              }
              else {
                if (bVar2 != 0x5d) {
                  if (bVar2 != 100) {
                    if (bVar2 != 0x66) goto switchD_00107950_caseD_6d;
                    lVar9 = 5;
                    pcVar7 = "false";
                    goto LAB_00107a57;
                  }
                  if (uVar8 <= uVar10 + 1) goto LAB_00107b71;
                  std::ostream::_M_insert<double>((double)local_48->tape[uVar10 + 1]);
                  goto LAB_00107a88;
                }
                local_38 = (ulong)((int)local_38 - 1);
                local_56[5] = 0x5d;
                std::__ostream_insert<char,std::char_traits<char>>(local_50,local_56 + 5,1);
                this = local_48;
              }
              goto LAB_00107b4f;
            }
            switch(bVar2) {
            case 0x6c:
              if (uVar8 <= uVar10 + 1) {
LAB_00107b71:
                operator_delete__(local_40);
                operator_delete__(pvVar5);
                return false;
              }
              std::ostream::_M_insert<long>((long)local_50);
LAB_00107a88:
              uVar10 = uVar10 + 1;
              break;
            case 0x6d:
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
switchD_00107950_caseD_6d:
              fprintf(_stderr,"bug %c\n",uVar1 >> 0x38);
              operator_delete__(local_40);
              operator_delete__(pvVar5);
              return false;
            case 0x6e:
              lVar9 = 4;
              pcVar7 = "null";
              goto LAB_00107a57;
            case 0x72:
              printjson();
              return false;
            case 0x74:
              lVar9 = 4;
              pcVar7 = "true";
LAB_00107a57:
              std::__ostream_insert<char,std::char_traits<char>>(local_50,pcVar7,lVar9);
              this = local_48;
              break;
            default:
              if (bVar2 != 0x7b) {
                if (bVar2 != 0x7d) goto switchD_00107950_caseD_6d;
                local_38 = (ulong)((int)local_38 - 1);
                local_56[3] = 0x7d;
                lVar9 = 1;
                pcVar7 = local_56 + 3;
                goto LAB_00107a57;
              }
              local_56[2] = 0x7b;
              std::__ostream_insert<char,std::char_traits<char>>(local_50,local_56 + 2,1);
              *(undefined1 *)((long)local_40 + lVar9 + 1) = 1;
LAB_00107b41:
              local_38 = lVar9 + 1;
              *(undefined8 *)((long)pvVar5 + lVar9 * 8 + 8) = 0;
              this = local_48;
            }
LAB_00107b4f:
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar8);
        }
        operator_delete__(local_40);
        operator_delete__(pvVar5);
        return true;
      }
      printjson();
    }
    else {
      printjson();
    }
  }
  return false;
}

Assistant:

WARN_UNUSED
bool ParsedJson::printjson(std::ostream &os) {
    if(!isvalid) { 
      return false;
    }
    size_t tapeidx = 0;
    uint64_t tape_val = tape[tapeidx];
    uint8_t type = (tape_val >> 56);
    size_t howmany = 0;
    if (type == 'r') {
      howmany = tape_val & JSONVALUEMASK;
    } else {
      fprintf(stderr, "Error: no starting root node?");
      return false;
    }
    if (howmany > tapecapacity) {
      fprintf(stderr,
          "We may be exceeding the tape capacity. Is this a valid document?\n");
      return false;
    }
    tapeidx++;
    bool *inobject = new bool[depthcapacity];
    auto *inobjectidx = new size_t[depthcapacity];
    int depth = 1; // only root at level 0
    inobjectidx[depth] = 0;
    inobject[depth] = false;
    for (; tapeidx < howmany; tapeidx++) {
      tape_val = tape[tapeidx];
      uint64_t payload = tape_val & JSONVALUEMASK;
      type = (tape_val >> 56);
      if (!inobject[depth]) {
        if ((inobjectidx[depth] > 0) && (type != ']')) {
          os << ",";
        }
        inobjectidx[depth]++;
      } else { // if (inobject) {
        if ((inobjectidx[depth] > 0) && ((inobjectidx[depth] & 1) == 0) &&
            (type != '}')) {
          os << ",";
        }
        if (((inobjectidx[depth] & 1) == 1)) {
          os << ":";
        }
        inobjectidx[depth]++;
      }
      switch (type) {
      case '"': // we have a string
        os << '"';
        print_with_escapes((const unsigned char *)(string_buf + payload));
        os << '"';
        break;
      case 'l': // we have a long int
        if (tapeidx + 1 >= howmany) {
          delete[] inobject;
          delete[] inobjectidx;
          return false;
        }
        os <<  static_cast<int64_t>(tape[++tapeidx]);
        break;
      case 'd': // we have a double
        if (tapeidx + 1 >= howmany){
          delete[] inobject;
          delete[] inobjectidx;
          return false;
        }
        double answer;
        memcpy(&answer, &tape[++tapeidx], sizeof(answer));
        os << answer;
        break;
      case 'n': // we have a null
        os << "null";
        break;
      case 't': // we have a true
        os << "true";
        break;
      case 'f': // we have a false
        os << "false";
        break;
      case '{': // we have an object
        os << '{';
        depth++;
        inobject[depth] = true;
        inobjectidx[depth] = 0;
        break;
      case '}': // we end an object
        depth--;
        os << '}';
        break;
      case '[': // we start an array
        os << '[';
        depth++;
        inobject[depth] = false;
        inobjectidx[depth] = 0;
        break;
      case ']': // we end an array
        depth--;
        os << ']';
        break;
      case 'r': // we start and end with the root node
        fprintf(stderr, "should we be hitting the root node?\n");
        delete[] inobject;
        delete[] inobjectidx;
        return false;
      default:
        fprintf(stderr, "bug %c\n", type);
        delete[] inobject;
        delete[] inobjectidx;
        return false;
      }
    }
    delete[] inobject;
    delete[] inobjectidx;
    return true;
}